

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O0

void anon_unknown.dwarf_196fac::generatePixel(int i,int j,half *rgbaValue,bool pIsLeft)

{
  byte in_CL;
  int in_ESI;
  int in_EDI;
  float fVar1;
  float fVar2;
  float f;
  float alphaValue;
  float blueValue;
  float greenValue;
  float redValue;
  
  if ((in_CL & 1) == 0) {
    fVar1 = ((float)in_EDI * 0.007 + (float)((in_EDI * 2) % 10)) / 10.0;
    fVar2 = ((float)in_ESI * 0.006 + (float)((in_EDI * in_EDI + in_ESI) % 10)) / 10.0;
    f = half::operator_cast_to_float((half *)&(anonymous_namespace)::ALPHA_DEFAULT_VALUE);
  }
  else {
    fVar1 = ((float)in_EDI * 0.006 + (float)((in_ESI * 2) % 10)) / 10.0;
    fVar2 = ((float)in_ESI * 0.003 + (float)((in_ESI * in_ESI + in_EDI) % 10)) / 10.0;
    f = half::operator_cast_to_float((half *)&(anonymous_namespace)::ALPHA_DEFAULT_VALUE);
  }
  half::operator=((half *)CONCAT44(fVar1,fVar2),f);
  half::operator=((half *)CONCAT44(fVar1,fVar2),f);
  half::operator=((half *)CONCAT44(fVar1,fVar2),f);
  half::operator=((half *)CONCAT44(fVar1,fVar2),f);
  return;
}

Assistant:

void
generatePixel (int i, int j, half* rgbaValue, bool pIsLeft)
{
    float redValue = 0.0f;
    float greenValue = 0.0f;
    float blueValue = 0.0f;
    float alphaValue = 0.0f;

    // These formulas are arbitrary but generate results that vary
    // depending on pixel position.  They are used to validate that
    // pixels are read/written correctly, because if we had only one
    // value for the whole image, the tests would still pass if we read
    // only one pixel and copied it all across the buffer.
    if(pIsLeft)
    {
        redValue = ((i + j) % 10 + 0.004f * j) / 10.0f;
        greenValue = ((j + j) % 10 + 0.006f * i) / 10.0f;
        blueValue = ((j * j + i) % 10 + 0.003f * j) / 10.0f;
        alphaValue = ALPHA_DEFAULT_VALUE;
    }
    else
    {
        redValue = ((i * j) % 10 + 0.005f * j) / 10.0f;
        greenValue = ((i + i) % 10 + 0.007f * i) / 10.0f;
        blueValue = ((i * i + j) % 10 + 0.006f * j) / 10.0f;
        alphaValue = ALPHA_DEFAULT_VALUE;
    }


    rgbaValue[0] = redValue;
    rgbaValue[1] = greenValue;
    rgbaValue[2] = blueValue;
    rgbaValue[3] = alphaValue;
}